

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

void __thiscall
boost::deflate::deflate_stream_test::doDeflate2_beast
          (deflate_stream_test *this,ICompressor *c,int level,int windowBits,int memLevel,
          int strategy,string *check)

{
  string *__return_storage_ptr__;
  byte bVar1;
  runner *prVar2;
  bool bVar3;
  __type cond;
  uInt uVar4;
  int iVar5;
  uint extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  wrap wrap;
  ulong_long_type uVar6;
  error_category *extraout_RDX;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  string out;
  undefined1 local_60 [16];
  string local_50;
  
  uVar7 = 1;
  do {
    if (check->_M_string_length <= uVar7) {
      return;
    }
    uVar10 = 1;
LAB_00108426:
    (*c->_vptr_ICompressor[1])
              (c,(ulong)(uint)level,(ulong)(uint)windowBits,(ulong)(uint)memLevel,
               (ulong)(uint)strategy);
    out._M_dataplus._M_p = (pointer)&out.field_2;
    out._M_string_length = 0;
    out.field_2._M_local_buf[0] = '\0';
    (*c->_vptr_ICompressor[0xb])(c,check->_M_string_length);
    std::__cxx11::string::resize((ulong)&out);
    if (uVar10 < out._M_string_length) {
      (*c->_vptr_ICompressor[5])(c,(check->_M_dataplus)._M_p);
      (*c->_vptr_ICompressor[3])(c,uVar7);
      (*c->_vptr_ICompressor[9])(c,out._M_dataplus._M_p);
      iVar8 = 0;
      bVar1 = 0;
      uVar9 = uVar10;
      do {
        (*c->_vptr_ICompressor[7])(c,uVar9);
        do {
          uVar4 = (*c->_vptr_ICompressor[0xc])(c,(ulong)(uint)(iVar8 << 2));
          system::error_code::error_code<boost::deflate::error>
                    ((error_code *)(local_60 + 0x10),need_buffers,(type *)0x0);
          if ((uInt)local_50._M_dataplus._M_p == uVar4) {
            uVar6 = *(ulong_long_type *)(local_50._M_string_length + 8);
            bVar3 = extraout_RDX->id_ == uVar6;
            if (uVar6 == 0) {
              bVar3 = extraout_RDX == (error_category *)local_50._M_string_length;
            }
            if (!bVar3) goto LAB_00108521;
LAB_00108626:
            wrap = (wrap)uVar6;
            (*c->_vptr_ICompressor[10])(c);
            std::__cxx11::string::resize((ulong)&out);
            prVar2 = test_suite::detail::current()::p;
            local_60._0_8_ = out._M_dataplus._M_p;
            local_60._8_8_ = out._M_string_length;
            __return_storage_ptr__ = (string *)(local_60 + 0x10);
            decompress_abi_cxx11_
                      (__return_storage_ptr__,(deflate_stream_test *)local_60,(string_view *)0x0,
                       wrap);
            cond = std::operator==(__return_storage_ptr__,check);
            test_suite::detail::runner::maybe_fail<bool>
                      (prVar2,cond,"decompress(out) == check",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
                       ,0x187,
                       "void boost::deflate::deflate_stream_test::doDeflate2_beast(ICompressor &, int, int, int, int, const std::string &)"
                       ,(char *)0x0);
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
LAB_001086a5:
            std::__cxx11::string::~string((string *)&out);
            uVar10 = uVar10 + 1;
            goto LAB_00108426;
          }
LAB_00108521:
          system::error_code::error_code<boost::deflate::error>
                    ((error_code *)local_60,end_of_stream,(type *)0x0);
          prVar2 = test_suite::detail::current()::p;
          if (local_60._0_4_ == uVar4) {
            uVar6 = *(ulong_long_type *)(local_60._8_8_ + 8);
            bVar3 = extraout_RDX->id_ == uVar6;
            if (uVar6 == 0) {
              bVar3 = extraout_RDX == (error_category *)local_60._8_8_;
            }
            if (bVar3) goto LAB_00108626;
          }
          (*extraout_RDX->_vptr_error_category[4])(local_60 + 0x10,extraout_RDX,uVar4);
          bVar3 = test_suite::detail::runner::maybe_fail<bool>
                            (prVar2,(extraout_var & 1) == 0,"! ec",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
                             ,0x177,
                             "void boost::deflate::deflate_stream_test::doDeflate2_beast(ICompressor &, int, int, int, int, const std::string &)"
                             ,(char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                               (uInt)local_50._M_dataplus._M_p));
          std::__cxx11::string::~string((string *)(local_60 + 0x10));
          if (!bVar3) goto LAB_001086a5;
          iVar5 = (*c->_vptr_ICompressor[2])(c);
          if (CONCAT44(extraout_var_00,iVar5) == 0 && iVar8 == 0) {
            (*c->_vptr_ICompressor[3])(c,check->_M_string_length - uVar7);
            iVar8 = 1;
          }
          iVar5 = (*c->_vptr_ICompressor[6])(c);
        } while ((bool)(CONCAT44(extraout_var_01,iVar5) != 0 | bVar1));
        uVar9 = out._M_string_length - uVar10;
        bVar1 = 1;
      } while( true );
    }
    std::__cxx11::string::~string((string *)&out);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void doDeflate2_beast(
        ICompressor& c,
        int level, int windowBits, int memLevel,
        int strategy, std::string const& check)
    {
        for(std::size_t i = 1; i < check.size(); ++i)
        {
            for(std::size_t j = 1;; ++j)
            {
                c.init(
                    level,
                    windowBits,
                    memLevel,
                    strategy);
                std::string out;
                out.resize(c.bound(check.size()));
                if(j >= out.size())
                    break;
                c.next_in((void*)check.data());
                c.avail_in(i);
                c.next_out((void*)out.data());
                c.avail_out(j);
                bool bi = false;
                bool bo = false;
                for(;;)
                {
                    error_code ec = c.write(
                        bi ? Flush::full : Flush::none);
                    if( ec == error::need_buffers ||
                        ec == error::end_of_stream) // per zlib FAQ
                        goto fin;
                    if(! BOOST_TESTS(! ec, ec.message().c_str()))
                        goto err;
                    if(c.avail_in() == 0 && ! bi)
                    {
                        bi = true;
                        c.avail_in(check.size() - i);
                    }
                    if(c.avail_out() == 0 && ! bo)
                    {
                        bo = true;
                        c.avail_out(out.size() - j);
                    }
                }

            fin:
                out.resize(c.total_out());
                BOOST_TEST(decompress(out) == check);

            err:
                ;
            }
        }
    }